

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

bool __thiscall
wallet::SQLiteBatch::WriteKey(SQLiteBatch *this,DataStream *key,DataStream *value,bool overwrite)

{
  long lVar1;
  pointer pbVar2;
  size_type sVar3;
  string_view source_file;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Logger *pLVar7;
  void *__stat_loc;
  string *in_R9;
  pointer pbVar8;
  sqlite3_stmt *this_00;
  long in_FS_OFFSET;
  Span<const_std::byte> blob;
  Span<const_std::byte> blob_00;
  string_view logging_function;
  string_view str;
  char local_e8 [112];
  string local_78;
  string log_msg;
  string *args_1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_database->m_db != (sqlite3 *)0x0) {
    if ((this->m_insert_stmt == (sqlite3_stmt *)0x0) ||
       (this->m_overwrite_stmt == (sqlite3_stmt *)0x0)) {
      __assert_fail("m_insert_stmt && m_overwrite_stmt",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
                    ,0x1e6,
                    "virtual bool wallet::SQLiteBatch::WriteKey(DataStream &&, DataStream &&, bool)"
                   );
    }
    this_00 = this->m_insert_stmt;
    if (overwrite) {
      this_00 = this->m_overwrite_stmt;
    }
    pbVar8 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start;
    pbVar2 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_finish;
    sVar3 = key->m_read_pos;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"key",(allocator<char> *)&local_78);
    pbVar8 = pbVar8 + sVar3;
    blob.m_size = (size_t)&log_msg;
    blob.m_data = pbVar2 + -(long)pbVar8;
    bVar4 = BindBlobToStatement((wallet *)this_00,(sqlite3_stmt *)&DAT_00000001,(int)pbVar8,blob,
                                in_R9);
    std::__cxx11::string::~string((string *)&log_msg);
    if (bVar4) {
      pbVar8 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      sVar3 = value->m_read_pos;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg,"value",(allocator<char> *)&local_78);
      pbVar8 = pbVar8 + sVar3;
      __stat_loc = (void *)0x2;
      args_1 = &log_msg;
      blob_00.m_size = (size_t)args_1;
      blob_00.m_data = pbVar2 + -(long)pbVar8;
      bVar4 = BindBlobToStatement((wallet *)this_00,(sqlite3_stmt *)0x2,(int)pbVar8,blob_00,in_R9);
      std::__cxx11::string::~string((string *)&log_msg);
      if (bVar4) {
        if (this->m_txn == false) {
          CSemaphore::wait(&this->m_database->m_write_semaphore,__stat_loc);
        }
        iVar6 = sqlite3_step(this_00);
        sqlite3_clear_bindings(this_00);
        sqlite3_reset(this_00);
        bVar4 = iVar6 == 0x65;
        if (!bVar4) {
          local_e8._0_8_ = sqlite3_errstr(iVar6);
          pLVar7 = LogInstance();
          bVar5 = BCLog::Logger::Enabled(pLVar7);
          if (bVar5) {
            log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
            log_msg._M_string_length = 0;
            log_msg.field_2._M_local_buf[0] = '\0';
            tinyformat::format<char[9],char_const*>
                      (&local_78,(tinyformat *)"%s: Unable to execute statement: %s\n","WriteKey",
                       (char (*) [9])local_e8,(char **)args_1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&log_msg,&local_78);
            std::__cxx11::string::~string((string *)&local_78);
            pLVar7 = LogInstance();
            local_78._M_dataplus._M_p = (pointer)0x5a;
            local_78._M_string_length = 0x6fecdb;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
            ;
            source_file._M_len = 0x5a;
            logging_function._M_str = "WriteKey";
            logging_function._M_len = 8;
            str._M_str = log_msg._M_dataplus._M_p;
            str._M_len = log_msg._M_string_length;
            BCLog::Logger::LogPrintStr(pLVar7,str,logging_function,source_file,0x1fc,ALL,Info);
            std::__cxx11::string::~string((string *)&log_msg);
          }
        }
        if (this->m_txn == false) {
          CSemaphore::post(&this->m_database->m_write_semaphore);
        }
        goto LAB_004a67b2;
      }
    }
  }
  bVar4 = false;
LAB_004a67b2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::WriteKey(DataStream&& key, DataStream&& value, bool overwrite)
{
    if (!m_database.m_db) return false;
    assert(m_insert_stmt && m_overwrite_stmt);

    sqlite3_stmt* stmt;
    if (overwrite) {
        stmt = m_overwrite_stmt;
    } else {
        stmt = m_insert_stmt;
    }

    // Bind: leftmost parameter in statement is index 1
    // Insert index 1 is key, 2 is value
    if (!BindBlobToStatement(stmt, 1, key, "key")) return false;
    if (!BindBlobToStatement(stmt, 2, value, "value")) return false;

    // Acquire semaphore if not previously acquired when creating a transaction.
    if (!m_txn) m_database.m_write_semaphore.wait();

    // Execute
    int res = sqlite3_step(stmt);
    sqlite3_clear_bindings(stmt);
    sqlite3_reset(stmt);
    if (res != SQLITE_DONE) {
        LogPrintf("%s: Unable to execute statement: %s\n", __func__, sqlite3_errstr(res));
    }

    if (!m_txn) m_database.m_write_semaphore.post();

    return res == SQLITE_DONE;
}